

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_UInt32 UA_NodeId_hash(UA_NodeId *n)

{
  ushort uVar1;
  UA_NodeIdType UVar2;
  UA_UInt32 UVar3;
  size_t size;
  anon_union_16_4_621dfe33_for_identifier *buf;
  
  UVar2 = n->identifierType;
  if (UVar2 != UA_NODEIDTYPE_STRING) {
    if (UVar2 == UA_NODEIDTYPE_GUID) {
      uVar1 = n->namespaceIndex;
      buf = &n->identifier;
      size = 0x10;
      goto LAB_00110368;
    }
    if (UVar2 != UA_NODEIDTYPE_BYTESTRING) {
      return (n->identifier).numeric * -0x61c8864f + (uint)n->namespaceIndex;
    }
  }
  uVar1 = n->namespaceIndex;
  size = (n->identifier).string.length;
  buf = (anon_union_16_4_621dfe33_for_identifier *)(n->identifier).string.data;
LAB_00110368:
  UVar3 = fnv32((uint)uVar1,(UA_Byte *)&buf->numeric,size);
  return UVar3;
}

Assistant:

UA_UInt32
UA_NodeId_hash(const UA_NodeId *n) {
    switch(n->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
    default:
        return (UA_UInt32)(n->namespaceIndex + (n->identifier.numeric * 2654435761)); /*  Knuth's multiplicative hashing */
    case UA_NODEIDTYPE_STRING:
    case UA_NODEIDTYPE_BYTESTRING:
        return fnv32(n->namespaceIndex, n->identifier.string.data, n->identifier.string.length);
    case UA_NODEIDTYPE_GUID:
        return fnv32(n->namespaceIndex, (const UA_Byte*)&n->identifier.guid, sizeof(UA_Guid));
    }
}